

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::setVerticalScrollMode(QAbstractItemView *this,ScrollMode mode)

{
  long lVar1;
  QScrollBar *this_00;
  long in_FS_OFFSET;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  *(undefined1 *)(lVar1 + 0x494) = 1;
  if (*(ScrollMode *)(lVar1 + 0x458) != mode) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = 0xaaaaaaaa;
    uStack_34 = 0xaaaaaaaa;
    uStack_30 = 0xaaaaaaaa;
    uStack_2c = 0xaaaaaaaa;
    (**(code **)(*(long *)this + 0x1f0))(&local_38,this);
    *(ScrollMode *)(lVar1 + 0x458) = mode;
    this_00 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    if (mode == ScrollPerItem) {
      QAbstractSliderPrivate::itemviewChangeSingleStep
                (*(QAbstractSliderPrivate **)
                  &(this_00->super_QAbstractSlider).super_QWidget.field_0x8,1);
    }
    else {
      QAbstractSlider::setSingleStep(&this_00->super_QAbstractSlider,-1);
    }
    (**(code **)(*(long *)this + 0x268))(this);
    (**(code **)(*(long *)this + 0x1e8))(this,&local_38,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::setVerticalScrollMode(ScrollMode mode)
{
    Q_D(QAbstractItemView);
    d->verticalScrollModeSet = true;
    if (mode == d->verticalScrollMode)
        return;
    QModelIndex topLeft = indexAt(QPoint(0, 0));
    d->verticalScrollMode = mode;
    if (mode == ScrollPerItem)
        verticalScrollBar()->d_func()->itemviewChangeSingleStep(1); // setSingleStep(-1) => step with 1
    else
        verticalScrollBar()->setSingleStep(-1); // Ensure that the view can update single step
    updateGeometries(); // update the scroll bars
    scrollTo(topLeft, QAbstractItemView::PositionAtTop);
}